

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O2

OperatorResultType __thiscall
duckdb::PhysicalPiecewiseMergeJoin::ExecuteInternal
          (PhysicalPiecewiseMergeJoin *this,ExecutionContext *context,DataChunk *input,
          DataChunk *chunk,GlobalOperatorState *gstate_p,OperatorState *state)

{
  byte bVar1;
  JoinType join_type;
  OperatorResultType OVar2;
  MergeJoinGlobalState *this_00;
  idx_t iVar3;
  pointer pGVar4;
  NotImplementedException *this_01;
  allocator local_51;
  string local_50;
  
  this_00 = (MergeJoinGlobalState *)
            unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
            ::operator->(&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                          super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                          sink_state);
  iVar3 = MergeJoinGlobalState::Count(this_00);
  if (iVar3 == 0) {
    join_type = (this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin.
                super_CachingPhysicalOperator.field_0x81;
    bVar1 = join_type - RIGHT;
    if ((bVar1 < 9) && ((0x18bU >> (bVar1 & 0x1f) & 1) != 0)) {
      return FINISHED;
    }
    pGVar4 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
             ::operator->(&this_00->table);
    PhysicalComparisonJoin::ConstructEmptyJoinResult
              (join_type,(pGVar4->has_null).super___atomic_base<unsigned_long>._M_i != 0,input,chunk
              );
  }
  else {
    DataChunk::Verify(input);
    bVar1 = (this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin.
            super_CachingPhysicalOperator.field_0x81;
    if (bVar1 - 1 < 4) {
      OVar2 = ResolveComplexJoin(this,context,input,chunk,state);
      return OVar2;
    }
    if (2 < bVar1 - 5) {
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,"Unimplemented type for piecewise merge loop join!",&local_51);
      NotImplementedException::NotImplementedException(this_01,&local_50);
      __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ResolveSimpleJoin(this,context,input,chunk,state);
  }
  return NEED_MORE_INPUT;
}

Assistant:

OperatorResultType PhysicalPiecewiseMergeJoin::ExecuteInternal(ExecutionContext &context, DataChunk &input,
                                                               DataChunk &chunk, GlobalOperatorState &gstate_p,
                                                               OperatorState &state) const {
	auto &gstate = sink_state->Cast<MergeJoinGlobalState>();

	if (gstate.Count() == 0) {
		// empty RHS
		if (!EmptyResultIfRHSIsEmpty()) {
			ConstructEmptyJoinResult(join_type, gstate.table->has_null, input, chunk);
			return OperatorResultType::NEED_MORE_INPUT;
		} else {
			return OperatorResultType::FINISHED;
		}
	}

	input.Verify();
	switch (join_type) {
	case JoinType::SEMI:
	case JoinType::ANTI:
	case JoinType::MARK:
		// simple joins can have max STANDARD_VECTOR_SIZE matches per chunk
		ResolveSimpleJoin(context, input, chunk, state);
		return OperatorResultType::NEED_MORE_INPUT;
	case JoinType::LEFT:
	case JoinType::INNER:
	case JoinType::RIGHT:
	case JoinType::OUTER:
		return ResolveComplexJoin(context, input, chunk, state);
	default:
		throw NotImplementedException("Unimplemented type for piecewise merge loop join!");
	}
}